

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::PatchPutValueCantChangeType<Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               PropertyOperationFlags flags)

{
  bool bVar1;
  DynamicObject *pDVar2;
  Type *pTVar3;
  undefined1 local_49;
  undefined8 local_48;
  Type *oldType;
  Var newValue_local;
  PropertyId propertyId_local;
  Var instance_local;
  InlineCacheIndex inlineCacheIndex_local;
  PolymorphicInlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  bVar1 = VarIs<Js::DynamicObject>(instance);
  if (bVar1) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject>(instance);
    local_48 = RecyclableObject::GetType(&pDVar2->super_RecyclableObject);
  }
  else {
    local_48 = (Type *)0x0;
  }
  PatchPutValueWithThisPtr<true,Js::PolymorphicInlineCache>
            (functionBody,inlineCache,inlineCacheIndex,instance,propertyId,newValue,instance,flags);
  local_49 = false;
  if (local_48 != (Type *)0x0) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject>(instance);
    pTVar3 = RecyclableObject::GetType(&pDVar2->super_RecyclableObject);
    local_49 = local_48 != pTVar3;
  }
  return local_49;
}

Assistant:

inline bool JavascriptOperators::PatchPutValueCantChangeType(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutValueCantChangeType);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchPutValueCantChangeType, Op_PatchPutValue);

        Type * oldType = VarIs<DynamicObject>(instance) ? UnsafeVarTo<DynamicObject>(instance)->GetType() : nullptr;
        PatchPutValueWithThisPtr<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, instance, propertyId, newValue, instance, flags);
        return (oldType != nullptr && oldType != UnsafeVarTo<DynamicObject>(instance)->GetType());

        JIT_HELPER_END(Op_PatchPutValueCantChangeType);
    }